

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsTTDPauseTimeTravelBeforeRuntimeOperation(void)

{
  bool bVar1;
  JsErrorCode JVar2;
  JsrtContext *currentContext_00;
  ScriptContext *this;
  ThreadContext *this_00;
  ThreadContext *threadContext;
  ScriptContext *scriptContext;
  JsErrorCode cCheck;
  JsrtContext *currentContext;
  
  currentContext_00 = JsrtContext::GetCurrent();
  JVar2 = CheckContext(currentContext_00,false,false);
  if (JVar2 == JsNoError) {
    this = JsrtContext::GetScriptContext(currentContext_00);
    this_00 = Js::ScriptContext::GetThreadContext(this);
    bVar1 = ThreadContext::IsRuntimeInTTDMode(this_00);
    if (bVar1) {
      TTD::EventLog::PushMode(this_00->TTDLog,ExcludedExecutionDebuggerAction);
    }
    return JsNoError;
  }
  TTDAbort_unrecoverable_error("Must have valid context when changing debugger mode.");
}

Assistant:

CHAKRA_API JsTTDPauseTimeTravelBeforeRuntimeOperation()
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    JsrtContext *currentContext = JsrtContext::GetCurrent();
    JsErrorCode cCheck = CheckContext(currentContext, JSRT_MAYBE_TRUE);
    TTDAssert(cCheck == JsNoError, "Must have valid context when changing debugger mode.");

    Js::ScriptContext* scriptContext = currentContext->GetScriptContext();
    ThreadContext* threadContext = scriptContext->GetThreadContext();

    if(threadContext->IsRuntimeInTTDMode())
    {
        threadContext->TTDLog->PushMode(TTD::TTDMode::ExcludedExecutionDebuggerAction);
    }

    return JsNoError;
#endif
}